

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_char_resize(ImVector_char *self,int new_size)

{
  int iVar1;
  char *__dest;
  int iVar2;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    if (iVar2 <= new_size) {
      iVar2 = new_size;
    }
    if (iVar1 < iVar2) {
      __dest = (char *)ImGui::MemAlloc((long)iVar2);
      if (self->Data != (char *)0x0) {
        memcpy(__dest,self->Data,(long)self->Size);
        ImGui::MemFree(self->Data);
      }
      self->Data = __dest;
      self->Capacity = iVar2;
    }
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_char_resize(ImVector_char* self,int new_size)
{
    return self->resize(new_size);
}